

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Reflection::GetOneofFieldDescriptor
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t number;
  FieldDescriptor *pFVar2;
  FieldDescriptor *pFVar3;
  FieldDescriptor *field;
  
  if ((oneof_descriptor->field_count_ == 1) &&
     (pFVar2 = oneof_descriptor->fields_, (pFVar2->field_0x1 & 2) != 0)) {
    bVar1 = HasField(this,message,pFVar2);
    pFVar3 = (FieldDescriptor *)0x0;
    if (bVar1) {
      pFVar3 = pFVar2;
    }
  }
  else {
    number = GetOneofCase(this,message,oneof_descriptor);
    if (number != 0) {
      pFVar2 = Descriptor::FindFieldByNumber(this->descriptor_,number);
      return pFVar2;
    }
    pFVar3 = (FieldDescriptor *)0x0;
  }
  return pFVar3;
}

Assistant:

const FieldDescriptor* Reflection::GetOneofFieldDescriptor(
    const Message& message, const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    const FieldDescriptor* field = oneof_descriptor->field(0);
    return HasField(message, field) ? field : nullptr;
  }
  uint32_t field_number = GetOneofCase(message, oneof_descriptor);
  if (field_number == 0) {
    return nullptr;
  }
  return descriptor_->FindFieldByNumber(field_number);
}